

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O3

string * Socks5ErrorString_abi_cxx11_(string *__return_storage_ptr__,uint8_t err)

{
  long lVar1;
  string *extraout_RAX;
  char *pcVar2;
  undefined7 in_register_00000031;
  char *pcVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((int)CONCAT71(in_register_00000031,err)) {
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_00d53c90:
      __stack_chk_fail();
    }
    pcVar3 = "general failure";
    pcVar2 = "";
    break;
  case 2:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00d53c90;
    pcVar3 = "connection not allowed";
    pcVar2 = "";
    break;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00d53c90;
    pcVar3 = "network unreachable";
    pcVar2 = "";
    break;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00d53c90;
    pcVar3 = "host unreachable";
    pcVar2 = "";
    break;
  case 5:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00d53c90;
    pcVar3 = "connection refused";
    pcVar2 = "";
    break;
  case 6:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00d53c90;
    pcVar3 = "TTL expired";
    pcVar2 = "";
    break;
  case 7:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00d53c90;
    pcVar3 = "protocol error";
    pcVar2 = "";
    break;
  case 8:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00d53c90;
    pcVar3 = "address type not supported";
    pcVar2 = "";
    break;
  default:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00d53c90;
    pcVar3 = "unknown";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return extraout_RAX;
}

Assistant:

static std::string Socks5ErrorString(uint8_t err)
{
    switch(err) {
        case SOCKS5Reply::GENFAILURE:
            return "general failure";
        case SOCKS5Reply::NOTALLOWED:
            return "connection not allowed";
        case SOCKS5Reply::NETUNREACHABLE:
            return "network unreachable";
        case SOCKS5Reply::HOSTUNREACHABLE:
            return "host unreachable";
        case SOCKS5Reply::CONNREFUSED:
            return "connection refused";
        case SOCKS5Reply::TTLEXPIRED:
            return "TTL expired";
        case SOCKS5Reply::CMDUNSUPPORTED:
            return "protocol error";
        case SOCKS5Reply::ATYPEUNSUPPORTED:
            return "address type not supported";
        default:
            return "unknown";
    }
}